

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractListView<QImage>::rowsRemoved(AbstractListView<QImage> *this,int first,int last)

{
  int iVar1;
  AbstractListViewPrivate<QImage> *this_00;
  AbstractListViewPrivate<QImage> *d;
  int last_local;
  int first_local;
  AbstractListView<QImage> *this_local;
  
  this_00 = d_func(this);
  if ((first <= this_00->firstVisibleRow) && (this_00->firstVisibleRow <= last)) {
    if ((this_00->model == (ListModel<QImage> *)0x0) ||
       (iVar1 = (**(code **)(*(long *)&this_00->model->super_AbstractListModel + 0x80))(),
       iVar1 == 0)) {
      this_00->firstVisibleRow = -1;
      this_00->offset = 0;
    }
    else {
      if (first + -1 < 0) {
        this_00->firstVisibleRow = last + 1;
      }
      else {
        this_00->firstVisibleRow = first + -1;
      }
      this_00->offset = 0;
    }
  }
  (**(code **)(*(long *)&(this->super_AbstractListViewBase).super_AbstractScrollArea + 0x1b8))();
  AbstractListViewPrivate<QImage>::updateIfNeeded(this_00,first,last);
  return;
}

Assistant:

void rowsRemoved( int first, int last ) override
	{
		AbstractListViewPrivate< T > * d = d_func();

		if( d->firstVisibleRow >= first && d->firstVisibleRow <= last )
		{
			if( d->model && d->model->rowCount() )
			{
				if( first - 1 >= 0 )
					d->firstVisibleRow = first - 1;
				else
					d->firstVisibleRow = last + 1;

				d->offset = 0;
			}
			else
			{
				d->firstVisibleRow = -1;
				d->offset = 0;
			}
		}

		recalculateSize();

		d->updateIfNeeded( first, last )	;
	}